

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O2

void __thiscall Moc::generate(Moc *this,FILE *out,FILE *jsonOutput)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  Moc *pMVar6;
  long lVar7;
  iterator classDef;
  iterator iVar8;
  PropertyDef *p;
  PropertyDef *pPVar9;
  char *pcVar10;
  QByteArray *candidate;
  Moc *pMVar11;
  ClassDef *pCVar12;
  FILE *pFVar13;
  ClassDef *cdef;
  QByteArray *pQVar14;
  ClassDef *pCVar15;
  const_iterator __begin1;
  PropertyDef *pPVar16;
  long lVar17;
  long in_FS_OFFSET;
  QByteArrayView bv;
  QByteArrayView QVar18;
  QList<ClassDef> *__range2;
  QLatin1String local_198;
  QArrayDataPointer<QByteArray> local_188;
  QArrayDataPointer<char> local_168;
  QArrayDataPointer<char> local_150;
  QArrayDataPointer<char> local_138;
  QJsonArray classesJsonFormatted;
  Generator generator;
  QJsonObject mocData;
  undefined7 uStack_6f;
  QJsonDocument jsonDoc;
  FILE *pFStack_50;
  ClassDef *local_48;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QVar18 = strippedFileName(this);
  fprintf((FILE *)out,
          "/****************************************************************************\n** Meta object code from reading C++ file \'%s\'\n**\n"
         );
  fprintf((FILE *)out,"** Created by: The Qt Meta Object Compiler version %d (Qt %s)\n**\n",0x45,
          "6.10.0");
  fwrite("** WARNING! All changes made in this file will be lost!\n*****************************************************************************/\n\n"
         ,0x88,1,(FILE *)out);
  if (this->noInclude == false) {
    lVar7 = (this->includePath).d.size;
    if ((lVar7 != 0) && ((this->includePath).d.ptr[lVar7 + -1] != '/')) {
      QByteArray::append((char)&this->includePath);
    }
    pQVar14 = (this->includeFiles).d.ptr;
    for (lVar7 = (this->includeFiles).d.size * 0x18; lVar7 != 0; lVar7 = lVar7 + -0x18) {
      generator.parser = (Moc *)(pQVar14->d).d;
      generator.out = (FILE *)(pQVar14->d).ptr;
      generator.cdef = (ClassDef *)(pQVar14->d).size;
      if (generator.parser != (Moc *)0x0) {
        LOCK();
        ((__atomic_base<int> *)&((generator.parser)->super_Parser).symbols.d.d)->_M_i =
             ((__atomic_base<int> *)&((generator.parser)->super_Parser).symbols.d.d)->_M_i + 1;
        UNLOCK();
      }
      if (((generator.cdef != (ClassDef *)0x0) && (*generator.out != (FILE)0x22)) &&
         (*generator.out != (FILE)0x3c)) {
        if ((this->includePath).d.size != 0) {
          _jsonDoc = "./";
          bVar2 = operator!=(&this->includePath,(char **)&jsonDoc);
          if (bVar2) {
            QByteArray::prepend((QByteArray *)&generator);
          }
        }
        _mocData = (Data *)CONCAT71(uStack_6f,'\"');
        QStringBuilder<QStringBuilder<char,_QByteArray_&>,_char>::convertTo<QByteArray>
                  ((QByteArray *)&jsonDoc,
                   (QStringBuilder<QStringBuilder<char,_QByteArray_&>,_char> *)&mocData);
        pCVar12 = generator.cdef;
        pFVar13 = generator.out;
        pMVar11 = generator.parser;
        generator.parser = (Moc *)_jsonDoc;
        generator.out = pFStack_50;
        _jsonDoc = (char *)pMVar11;
        pFStack_50 = pFVar13;
        generator.cdef = local_48;
        local_48 = pCVar12;
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&jsonDoc);
      }
      pFVar13 = generator.out;
      if (generator.out == (FILE *)0x0) {
        pFVar13 = (FILE *)&QByteArray::_empty;
      }
      fprintf((FILE *)out,"#include %s\n",pFVar13);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&generator);
      pQVar14 = pQVar14 + 1;
    }
  }
  if ((this->classList).d.size != 0) {
    generator.parser = (Moc *)anon_var_dwarf_3ecba;
    bVar2 = operator==((QByteArray *)(this->classList).d.ptr,(char **)&generator);
    if (bVar2) {
      fwrite("#include <QtCore/qobject.h>\n",0x1c,1,(FILE *)out);
    }
  }
  fwrite("#include <QtCore/qmetatype.h>\n",0x1e,1,(FILE *)out);
  if (this->mustIncludeQPluginH == true) {
    fwrite("#include <QtCore/qplugin.h>\n",0x1c,1,(FILE *)out);
  }
  local_188.size = -0x5555555555555556;
  local_188.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_188.ptr = (QByteArray *)0xaaaaaaaaaaaaaaaa;
  if ((requiredQtContainers(QList<ClassDef>const&)::candidates == '\0') &&
     (iVar5 = __cxa_guard_acquire(&requiredQtContainers(QList<ClassDef>const&)::candidates),
     iVar5 != 0)) {
    requiredQtContainers(QList<ClassDef>const&)::candidates._0_8_ = 0;
    requiredQtContainers(QList<ClassDef>const&)::candidates._8_8_ = 0;
    requiredQtContainers(QList<ClassDef>const&)::candidates._16_8_ = 0;
    QByteArray::QByteArray((QByteArray *)&generator,"QSharedPointer",-1);
    QList<QByteArray>::emplaceBack<QByteArray>
              ((QList<QByteArray> *)requiredQtContainers(QList<ClassDef>const&)::candidates,
               (QByteArray *)&generator);
    QByteArray::QByteArray((QByteArray *)&jsonDoc,"QWeakPointer",-1);
    QList<QByteArray>::emplaceBack<QByteArray>
              ((QList<QByteArray> *)requiredQtContainers(QList<ClassDef>const&)::candidates,
               (QByteArray *)&jsonDoc);
    QByteArray::QByteArray((QByteArray *)&mocData,"QPointer",-1);
    QList<QByteArray>::emplaceBack<QByteArray>
              ((QList<QByteArray> *)requiredQtContainers(QList<ClassDef>const&)::candidates,
               (QByteArray *)&mocData);
    QByteArray::QByteArray((QByteArray *)&classesJsonFormatted,"QList",-1);
    QList<QByteArray>::emplaceBack<QByteArray>
              ((QList<QByteArray> *)requiredQtContainers(QList<ClassDef>const&)::candidates,
               (QByteArray *)&classesJsonFormatted);
    QByteArray::QByteArray((QByteArray *)&local_138,"QQueue",-1);
    QList<QByteArray>::emplaceBack<QByteArray>
              ((QList<QByteArray> *)requiredQtContainers(QList<ClassDef>const&)::candidates,
               (QByteArray *)&local_138);
    QByteArray::QByteArray((QByteArray *)&local_150,"QStack",-1);
    QList<QByteArray>::emplaceBack<QByteArray>
              ((QList<QByteArray> *)requiredQtContainers(QList<ClassDef>const&)::candidates,
               (QByteArray *)&local_150);
    QByteArray::QByteArray((QByteArray *)&local_168,"QSet",-1);
    QList<QByteArray>::emplaceBack<QByteArray>
              ((QList<QByteArray> *)requiredQtContainers(QList<ClassDef>const&)::candidates,
               (QByteArray *)&local_168);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_168);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_150);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_138);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&classesJsonFormatted);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&mocData);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&jsonDoc);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&generator);
    __cxa_atexit(QList<QByteArray>::~QList,requiredQtContainers(QList<ClassDef>const&)::candidates,
                 &__dso_handle);
    __cxa_guard_release(&requiredQtContainers(QList<ClassDef>const&)::candidates);
  }
  local_188.d = (Data *)0x0;
  local_188.ptr = (QByteArray *)0x0;
  local_188.size = 0;
  QList<QByteArray>::reserve
            ((QList<QByteArray> *)&local_188,
             requiredQtContainers(QList<ClassDef>const&)::candidates._16_8_);
  pMVar6 = (Moc *)(requiredQtContainers(QList<ClassDef>const&)::candidates._16_8_ * 0x18 +
                  requiredQtContainers(QList<ClassDef>const&)::candidates._8_8_);
  bVar2 = false;
  pMVar11 = (Moc *)requiredQtContainers(QList<ClassDef>const&)::candidates._8_8_;
  do {
    if (pMVar11 == pMVar6) {
      if (bVar2) {
        QByteArray::QByteArray((QByteArray *)&generator,"QProperty",-1);
        QList<QByteArray>::emplaceBack<QByteArray>
                  ((QList<QByteArray> *)&local_188,(QByteArray *)&generator);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&generator);
      }
      pQVar14 = local_188.ptr;
      for (lVar7 = local_188.size * 0x18; lVar7 != 0; lVar7 = lVar7 + -0x18) {
        pcVar10 = (pQVar14->d).ptr;
        if (pcVar10 == (char *)0x0) {
          pcVar10 = (char *)&QByteArray::_empty;
        }
        fprintf((FILE *)out,"#include <QtCore/%s>\n",pcVar10);
        pQVar14 = pQVar14 + 1;
      }
      fwrite("\n#include <QtCore/qtmochelpers.h>\n",0x22,1,(FILE *)out);
      fwrite("\n#include <memory>\n\n",0x14,1,(FILE *)out);
      fwrite("\n#include <QtCore/qxptype_traits.h>\n",0x24,1,(FILE *)out);
      fprintf((FILE *)out,
              "#if !defined(Q_MOC_OUTPUT_REVISION)\n#error \"The header file \'%s\' doesn\'t include <QObject>.\"\n"
              ,QVar18.m_data);
      fprintf((FILE *)out,"#elif Q_MOC_OUTPUT_REVISION != %d\n",0x45);
      fprintf((FILE *)out,
              "#error \"This file was generated using the moc from %s. It\"\n#error \"cannot be used with the include files from this version of Qt.\"\n#error \"(The moc has changed too much.)\"\n"
              ,"6.10.0");
      fwrite("#endif\n\n",8,1,(FILE *)out);
      fwrite("#ifndef Q_CONSTINIT\n#define Q_CONSTINIT\n#endif\n\n",0x30,1,(FILE *)out);
      fwrite("QT_WARNING_PUSH\n",0x10,1,(FILE *)out);
      fwrite("QT_WARNING_DISABLE_DEPRECATED\n",0x1e,1,(FILE *)out);
      fwrite("QT_WARNING_DISABLE_GCC(\"-Wuseless-cast\")\n",0x29,1,(FILE *)out);
      fputs("",(FILE *)out);
      classDef = QList<ClassDef>::begin(&this->classList);
      iVar8 = QList<ClassDef>::end(&this->classList);
      for (; classDef.i != iVar8.i; classDef.i = classDef.i + 1) {
        memset(&generator,0xaa,0x90);
        Generator::Generator
                  (&generator,this,classDef.i,&this->metaTypes,&this->knownQObjectClasses,
                   &this->knownGadgets,out,this->requireCompleteTypes);
        Generator::generateCode(&generator);
        if (0x7ffffffe < (ulong)generator.strings.d.size) {
          Parser::error(&this->super_Parser,
                        "internal limit exceeded: number of parsed strings is too big.");
        }
        Generator::~Generator(&generator);
      }
      fputs("",(FILE *)out);
      fwrite("QT_WARNING_POP\n",0xf,1,(FILE *)out);
      if (jsonOutput != (FILE *)0x0) {
        _mocData = (Data *)0xaaaaaaaaaaaaaaaa;
        QJsonObject::QJsonObject(&mocData);
        QJsonValue::QJsonValue((QJsonValue *)&generator,0x45);
        _jsonDoc = (char *)QJsonObject::operator[]((QLatin1String *)&mocData);
        QJsonValueRef::operator=((QJsonValueRef *)&jsonDoc,(QJsonValue *)&generator);
        QJsonValue::~QJsonValue((QJsonValue *)&generator);
        QLatin1String::QLatin1String(&local_198,QVar18.m_data);
        QJsonValue::QJsonValue((QJsonValue *)&generator,(QLatin1String *)local_198.m_size);
        _jsonDoc = (char *)QJsonObject::operator[]((QLatin1String *)&mocData);
        QJsonValueRef::operator=((QJsonValueRef *)&jsonDoc,(QJsonValue *)&generator);
        QJsonValue::~QJsonValue((QJsonValue *)&generator);
        _classesJsonFormatted = (Data *)0xaaaaaaaaaaaaaaaa;
        QJsonArray::QJsonArray(&classesJsonFormatted);
        for (lVar7 = (this->classList).d.size * 0x1a8; lVar7 != 0; lVar7 = lVar7 + -0x1a8) {
          ClassDef::toJson((ClassDef *)&jsonDoc);
          QJsonValue::QJsonValue((QJsonValue *)&generator,(QJsonObject *)&jsonDoc);
          QJsonArray::append((QJsonValue *)&classesJsonFormatted);
          QJsonValue::~QJsonValue((QJsonValue *)&generator);
          QJsonObject::~QJsonObject((QJsonObject *)&jsonDoc);
        }
        cVar4 = QJsonArray::isEmpty();
        if (cVar4 == '\0') {
          QJsonValue::QJsonValue((QJsonValue *)&generator,&classesJsonFormatted);
          _jsonDoc = (char *)QJsonObject::operator[]((QLatin1String *)&mocData);
          QJsonValueRef::operator=((QJsonValueRef *)&jsonDoc,(QJsonValue *)&generator);
          QJsonValue::~QJsonValue((QJsonValue *)&generator);
        }
        _jsonDoc = (char *)0xaaaaaaaaaaaaaaaa;
        QJsonDocument::QJsonDocument(&jsonDoc,&mocData);
        QJsonDocument::toJson(&generator,&jsonDoc,0);
        pFVar13 = generator.out;
        if (generator.out == (FILE *)0x0) {
          pFVar13 = (FILE *)&QByteArray::_empty;
        }
        fputs((char *)pFVar13,(FILE *)jsonOutput);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&generator);
        QJsonDocument::~QJsonDocument(&jsonDoc);
        QJsonArray::~QJsonArray(&classesJsonFormatted);
        QJsonObject::~QJsonObject(&mocData);
      }
      QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_188);
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return;
    }
    generator.cdef = (ClassDef *)0xaaaaaaaaaaaaaaaa;
    generator.parser = (Moc *)0xaaaaaaaaaaaaaaaa;
    generator.out = (FILE *)0xaaaaaaaaaaaaaaaa;
    _jsonDoc = (char *)pMVar11;
    QStringBuilder<const_QByteArray_&,_char>::convertTo<QByteArray>
              ((QByteArray *)&generator,(QStringBuilder<const_QByteArray_&,_char> *)&jsonDoc);
    pCVar12 = (this->classList).d.ptr;
    pCVar15 = pCVar12 + (this->classList).d.size;
    do {
      if (pCVar12 == pCVar15) goto LAB_0011900f;
      pPVar16 = (pCVar12->propertyList).d.ptr;
      lVar17 = (pCVar12->propertyList).d.size * 0x158;
      pPVar9 = pPVar16;
      for (lVar7 = lVar17; lVar7 != 0; lVar7 = lVar7 + -0x158) {
        bVar2 = (bool)(bVar2 | (pPVar9->bind).d.size != 0);
        pPVar9 = pPVar9 + 1;
      }
      while (lVar17 != 0) {
        bv.m_data = (storage_type *)generator.out;
        bv.m_size = (qsizetype)generator.cdef;
        bVar3 = QByteArray::contains(&pPVar16->type,bv);
        pPVar16 = pPVar16 + 1;
        lVar17 = lVar17 + -0x158;
        if (bVar3) goto LAB_00119002;
      }
      bVar3 = any_arg_contains(&pCVar12->slotList,(QByteArray *)&generator);
      if ((bVar3) ||
         (bVar3 = any_arg_contains(&pCVar12->signalList,(QByteArray *)&generator), bVar3)) break;
      bVar3 = any_arg_contains(&pCVar12->methodList,(QByteArray *)&generator);
      pCVar12 = pCVar12 + 1;
    } while (!bVar3);
LAB_00119002:
    QList<QByteArray>::emplaceBack<QByteArray_const&>
              ((QList<QByteArray> *)&local_188,(QByteArray *)pMVar11);
LAB_0011900f:
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&generator);
    pMVar11 = (Moc *)&(pMVar11->super_Parser).index;
  } while( true );
}

Assistant:

void Moc::generate(FILE *out, FILE *jsonOutput)
{
    QByteArrayView fn = strippedFileName();

    fprintf(out, "/****************************************************************************\n"
            "** Meta object code from reading C++ file '%s'\n**\n" , fn.constData());
    fprintf(out, "** Created by: The Qt Meta Object Compiler version %d (Qt %s)\n**\n" , mocOutputRevision, QT_VERSION_STR);
    fprintf(out, "** WARNING! All changes made in this file will be lost!\n"
            "*****************************************************************************/\n\n");

    // include header(s) of user class definitions at _first_ to allow
    // for preprocessor definitions possibly affecting standard headers.
    // see https://codereview.qt-project.org/c/qt/qtbase/+/445937
    if (!noInclude) {
        if (includePath.size() && !includePath.endsWith('/'))
            includePath += '/';
        for (QByteArray inc : std::as_const(includeFiles)) {
            if (!inc.isEmpty() && inc.at(0) != '<' && inc.at(0) != '"') {
                if (includePath.size() && includePath != "./")
                    inc.prepend(includePath);
                inc = '\"' + inc + '\"';
            }
            fprintf(out, "#include %s\n", inc.constData());
        }
    }
    if (classList.size() && classList.constFirst().classname == "Qt")
        fprintf(out, "#include <QtCore/qobject.h>\n");

    fprintf(out, "#include <QtCore/qmetatype.h>\n");  // For QMetaType::Type
    if (mustIncludeQPluginH)
        fprintf(out, "#include <QtCore/qplugin.h>\n");

    const auto qtContainers = requiredQtContainers(classList);
    for (const QByteArray &qtContainer : qtContainers)
        fprintf(out, "#include <QtCore/%s>\n", qtContainer.constData());

    fprintf(out, "\n#include <QtCore/qtmochelpers.h>\n");

    fprintf(out, "\n#include <memory>\n\n");  // For std::addressof
    fprintf(out, "\n#include <QtCore/qxptype_traits.h>\n"); // is_detected

    fprintf(out, "#if !defined(Q_MOC_OUTPUT_REVISION)\n"
            "#error \"The header file '%s' doesn't include <QObject>.\"\n", fn.constData());
    fprintf(out, "#elif Q_MOC_OUTPUT_REVISION != %d\n", mocOutputRevision);
    fprintf(out, "#error \"This file was generated using the moc from %s."
            " It\"\n#error \"cannot be used with the include files from"
            " this version of Qt.\"\n#error \"(The moc has changed too"
            " much.)\"\n", QT_VERSION_STR);
    fprintf(out, "#endif\n\n");

#if QT_VERSION <= QT_VERSION_CHECK(7, 0, 0)
    fprintf(out, "#ifndef Q_CONSTINIT\n"
            "#define Q_CONSTINIT\n"
            "#endif\n\n");
#endif

    fprintf(out, "QT_WARNING_PUSH\n");
    fprintf(out, "QT_WARNING_DISABLE_DEPRECATED\n");
    fprintf(out, "QT_WARNING_DISABLE_GCC(\"-Wuseless-cast\")\n");

    fputs("", out);
    for (ClassDef &def : classList) {
        Generator generator(this, &def, metaTypes, knownQObjectClasses, knownGadgets, out,
                            requireCompleteTypes);
        generator.generateCode();

        // generator.generateCode() should have already registered all strings
        if (Q_UNLIKELY(generator.registeredStringsCount() >= std::numeric_limits<int>::max())) {
            error("internal limit exceeded: number of parsed strings is too big.");
            exit(EXIT_FAILURE);
        }
    }
    fputs("", out);

    fprintf(out, "QT_WARNING_POP\n");

    if (jsonOutput) {
        QJsonObject mocData;
        mocData["outputRevision"_L1] = mocOutputRevision;
        mocData["inputFile"_L1] = QLatin1StringView(fn.constData());

        QJsonArray classesJsonFormatted;

        for (const ClassDef &cdef: std::as_const(classList))
            classesJsonFormatted.append(cdef.toJson());

        if (!classesJsonFormatted.isEmpty())
            mocData["classes"_L1] = classesJsonFormatted;

        QJsonDocument jsonDoc(mocData);
        fputs(jsonDoc.toJson().constData(), jsonOutput);
    }
}